

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86assembler.cpp
# Opt level: O2

Error __thiscall asmjit::x86::Assembler::onAttach(Assembler *this,CodeHolder *code)

{
  byte bVar1;
  Error EVar2;
  
  bVar1 = (code->_environment)._arch;
  if (bVar1 - 1 < 2) {
    EVar2 = BaseAssembler::onAttach(&this->super_BaseAssembler,code);
    if (EVar2 == 0) {
      (this->super_BaseAssembler).super_BaseEmitter._forcedInstOptions =
           (uint)bVar1 << 0x1f |
           (this->super_BaseAssembler).super_BaseEmitter._forcedInstOptions & 0x7fffffff;
      (this->super_BaseAssembler).super_BaseEmitter._privateData =
           (uint)((bVar1 & 1) == 0) * 0x40 + 0x40;
      EVar2 = 0;
    }
  }
  else {
    EVar2 = 4;
  }
  return EVar2;
}

Assistant:

ASMJIT_INLINE void emitMMAndOpcode(uint32_t opcode) noexcept {
    uint32_t mmIndex = (opcode & Opcode::kMM_Mask) >> Opcode::kMM_Shift;
    const X86OpcodeMM& mmCode = x86OpcodeMM[mmIndex];

    emit8If(mmCode.data[0], mmCode.size > 0);
    emit8If(mmCode.data[1], mmCode.size > 1);
    emit8(opcode);
  }